

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O0

HANDLE CreateMutexA(LPSECURITY_ATTRIBUTES lpMutexAttributes,BOOL bInitialOwner,LPCSTR lpName)

{
  CPalThread *pthr_00;
  DWORD local_34;
  PAL_ERROR palError;
  CPalThread *pthr;
  HANDLE hMutex;
  LPCSTR lpName_local;
  LPSECURITY_ATTRIBUTES p_Stack_10;
  BOOL bInitialOwner_local;
  LPSECURITY_ATTRIBUTES lpMutexAttributes_local;
  
  pthr = (CPalThread *)0x0;
  hMutex = lpName;
  lpName_local._4_4_ = bInitialOwner;
  p_Stack_10 = lpMutexAttributes;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pthr_00 = CorUnix::InternalGetCurrentThread();
  if (hMutex == (HANDLE)0x0) {
    local_34 = CorUnix::InternalCreateMutex
                         (pthr_00,p_Stack_10,lpName_local._4_4_,(LPCWSTR)0x0,&pthr);
  }
  else {
    fprintf(_stderr,"] %s %s:%d","CreateMutexA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x5b);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    local_34 = 0x32;
  }
  CorUnix::CPalThread::SetLastError(local_34);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return pthr;
}

Assistant:

HANDLE
PALAPI
CreateMutexA(
    IN LPSECURITY_ATTRIBUTES lpMutexAttributes,
    IN BOOL bInitialOwner,
    IN LPCSTR lpName)
{
    HANDLE hMutex = NULL;
    CPalThread *pthr = NULL;
    PAL_ERROR palError;

    PERF_ENTRY(CreateMutexA);
    ENTRY("CreateMutexA(lpMutexAttr=%p, bInitialOwner=%d, lpName=%p (%s)\n",
          lpMutexAttributes, bInitialOwner, lpName, lpName?lpName:"NULL");

    pthr = InternalGetCurrentThread();

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }
    else
    {
        palError = InternalCreateMutex(
            pthr,
            lpMutexAttributes,
            bInitialOwner,
            NULL,
            &hMutex
            );
    }

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pthr->SetLastError(palError);

    LOGEXIT("CreateMutexA returns HANDLE %p\n", hMutex);
    PERF_EXIT(CreateMutexA);
    return hMutex;
}